

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::invalidateMipmap(Texture *this)

{
  long in_RDI;
  TextureSaver save;
  TransientContextLock lock;
  TransientContextLock *in_stack_ffffffffffffffe0;
  TransientContextLock *in_stack_fffffffffffffff0;
  
  if ((*(byte *)(in_RDI + 0x19) & 1) != 0) {
    GlResource::TransientContextLock::TransientContextLock(in_stack_fffffffffffffff0);
    priv::TextureSaver::TextureSaver((TextureSaver *)0x2ce5ae);
    (*sf_glad_glBindTexture)(0xde1,*(GLuint *)(in_RDI + 0x10));
    (*sf_glad_glTexParameteri)(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2600);
    *(undefined1 *)(in_RDI + 0x19) = 0;
    priv::TextureSaver::~TextureSaver((TextureSaver *)0x2ce605);
    GlResource::TransientContextLock::~TransientContextLock(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void Texture::invalidateMipmap()
{
    if (!m_hasMipmap)
        return;

    TransientContextLock lock;

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));

    m_hasMipmap = false;
}